

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

UBool numfmt_cleanup(void)

{
  icu_63::UInitOnce::reset(&gServiceInitOnce);
  if (gService != (ICULocaleService *)0x0) {
    if (gService != (ICULocaleService *)0x0) {
      (*(gService->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[1])();
    }
    gService = (ICULocaleService *)0x0;
  }
  icu_63::UInitOnce::reset(&gNSCacheInitOnce);
  if (NumberingSystem_cache != (UHashtable *)0x0) {
    uhash_close_63(NumberingSystem_cache);
    NumberingSystem_cache = (UHashtable *)0x0;
  }
  return '\x01';
}

Assistant:

static UBool U_CALLCONV numfmt_cleanup(void) {
#if !UCONFIG_NO_SERVICE
    gServiceInitOnce.reset();
    if (gService) {
        delete gService;
        gService = NULL;
    }
#endif
    gNSCacheInitOnce.reset();
    if (NumberingSystem_cache) {
        // delete NumberingSystem_cache;
        uhash_close(NumberingSystem_cache);
        NumberingSystem_cache = NULL;
    }
    return TRUE;
}